

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O1

ExecutionResult __thiscall nigel::AST_Parser::onExecute(AST_Parser *this,CodeBase *base)

{
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  _List_node_base *p_Var5;
  AST_Parser *this_01;
  shared_ptr<nigel::AstExpr> expr;
  undefined1 local_49;
  undefined1 local_48 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  (this->currItr)._M_node =
       (base->lexerStruct).
       super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  this->base = base;
  local_48._0_8_ = (AstBlock *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nigel::AstBlock,std::allocator<nigel::AstBlock>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8),(AstBlock **)local_48,
             (allocator<nigel::AstBlock> *)&local_49);
  std::__shared_ptr<nigel::AstBlock,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<nigel::AstBlock,nigel::AstBlock>
            ((__shared_ptr<nigel::AstBlock,(__gnu_cxx::_Lock_policy)2> *)local_48,
             (AstBlock *)local_48._0_8_);
  uVar3 = local_48._8_8_;
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (_func_int **)0x0;
  local_48._8_8_ = (AST_Parser *)0x0;
  this_00 = (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this_01 = (AST_Parser *)local_48._8_8_;
  if ((AST_Parser *)local_48._8_8_ != (AST_Parser *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  local_48._24_8_ =
       (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28 = (base->globalAst).super___shared_ptr<nigel::AstBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  fillSFR(this_01,(shared_ptr<nigel::AstBlock> *)(local_48 + 0x18));
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  std::deque<std::shared_ptr<nigel::AstBlock>,_std::allocator<std::shared_ptr<nigel::AstBlock>_>_>::
  push_back(&(this->blockStack).c,&base->globalAst);
  this->finishedParsing = false;
  do {
    resolveNextExpr((AST_Parser *)local_48);
    if ((AST_Parser *)local_48._8_8_ != (AST_Parser *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  } while (this->finishedParsing == false);
  plVar1 = &(this->super_BuilderExecutable).notificationList;
  bVar4 = 0;
  p_Var5 = (_List_node_base *)plVar1;
  do {
    p_Var5 = (((_List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)plVar1) goto LAB_00132b25;
  } while (*(int *)p_Var5[1]._M_next - 0x7fffU < 0xffff8002);
  bVar4 = 1;
LAB_00132b25:
  if (base->printAST == true) {
    printAST(this,base);
  }
  return (uint)bVar4 * 5;
}

Assistant:

ExecutionResult AST_Parser::onExecute( CodeBase &base )
	{
		//Set current iterator
		currItr = base.lexerStruct.begin();
		this->base = &base;

		base.globalAst = std::make_shared<AstBlock>();
		fillSFR( base.globalAst );
		blockStack.push( base.globalAst );

		finishedParsing = false;

		while( !finishedParsing )//Iterate the lexer
		{
			std::shared_ptr<AstExpr> expr = resolveNextExpr();
		}

		bool hasError = false;
		for( auto &n : notificationList ) if( n->type > NT::begin_err && n->type < NT::begin_warning )
		{
			hasError = true;
			break;
		}

		if( base.printAST ) printAST( base );

		if( hasError ) return ExecutionResult::astParsingFailed;
		else return ExecutionResult::success;
	}